

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O2

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_GetDevice
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,char *deviceId,
          IOTHUB_DEVICE *deviceInfo)

{
  IOTHUB_REGISTRYMANAGER_RESULT IVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;
  
  if ((deviceId == (char *)0x0 || registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) ||
      deviceInfo == (IOTHUB_DEVICE *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else {
      IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_GetDevice",0x642,1,"Input parameter cannot be NULL");
    }
  }
  else {
    memset(&deviceOrModuleInfo,0,0xa0);
    IVar1 = IoTHubRegistryManager_GetDeviceOrModule
                      (registryManagerHandle,deviceId,(char *)0x0,&deviceOrModuleInfo);
    if (IVar1 == IOTHUB_REGISTRYMANAGER_OK) {
      move_deviceOrModule_members_to_device(&deviceOrModuleInfo,deviceInfo);
      free_nonDevice_members_from_deviceOrModule(&deviceOrModuleInfo);
    }
  }
  return IVar1;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_GetDevice(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const char* deviceId, IOTHUB_DEVICE* deviceInfo)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceId == NULL) || (deviceInfo == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else
    {
        IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;
        memset(&deviceOrModuleInfo, 0, sizeof(deviceOrModuleInfo));

        result = IoTHubRegistryManager_GetDeviceOrModule(registryManagerHandle, deviceId, NULL, &deviceOrModuleInfo);
        if (result == IOTHUB_REGISTRYMANAGER_OK)
        {
            move_deviceOrModule_members_to_device(&deviceOrModuleInfo, deviceInfo);
            free_nonDevice_members_from_deviceOrModule(&deviceOrModuleInfo);
        }
    }

    return result;
}